

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandRunSim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  FILE *pFile;
  int fVeryVerbose;
  int fVerbose;
  int fSkipMffc;
  int fInputs;
  int fUseWeights;
  int fRandom;
  int fUseBuf;
  int fFancy;
  int fOrder;
  int LevU;
  int LevL;
  int nBeam;
  int nWords;
  int c;
  char *pFileNames [4];
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  _nWords = (char *)0x0;
  pFileNames[0] = (char *)0x0;
  pFileNames[1] = "out.v";
  pFileNames[2] = (char *)0x0;
  LevL = 8;
  LevU = 4;
  fOrder = -1;
  fFancy = -1;
  fUseBuf = 0;
  fRandom = 0;
  fUseWeights = 0;
  fInputs = 0;
  fSkipMffc = 0;
  fVerbose = 0;
  fVeryVerbose = 0;
  pFile._4_4_ = 0;
  pFile._0_4_ = 0;
  Extra_UtilGetoptReset();
LAB_0026e5eb:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"WBLUofbruimvwh");
    if (iVar1 == -1) {
      if ((1 < argc - globalUtilOptind) && (argc - globalUtilOptind < 5)) {
        Gia_ManRandom(1);
        for (nBeam = 0; nBeam < argc - globalUtilOptind; nBeam = nBeam + 1) {
          *(char **)(&nWords + (long)nBeam * 2) = argv[globalUtilOptind + nBeam];
        }
        nBeam = 0;
        while( true ) {
          if ((argc - globalUtilOptind) + -1 <= nBeam) {
            Acb_NtkRunSim((char **)&nWords,LevL,LevU,fOrder,fFancy,fUseBuf,fRandom,fUseWeights,
                          fInputs,fSkipMffc,fVerbose,fVeryVerbose,pFile._4_4_,(uint)pFile);
            return 0;
          }
          __stream = fopen(*(char **)(&nWords + (long)nBeam * 2),"rb");
          if (__stream == (FILE *)0x0) break;
          fclose(__stream);
          nBeam = nBeam + 1;
        }
        printf("Cannot open input file \"%s\".\n",*(undefined8 *)(&nWords + (long)nBeam * 2));
        return 0;
      }
      Abc_Print(1,"Expecting two or three file names on the command line.\n");
      goto LAB_0026ea10;
    }
    switch(iVar1) {
    case 0x42:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-B\" should be followed by an integer.\n");
        goto LAB_0026ea10;
      }
      LevU = atoi(argv[globalUtilOptind]);
      iVar1 = LevU;
      break;
    default:
      goto LAB_0026ea10;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_0026ea10;
      }
      fOrder = atoi(argv[globalUtilOptind]);
      iVar1 = fOrder;
      break;
    case 0x55:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-U\" should be followed by an integer.\n");
        goto LAB_0026ea10;
      }
      fFancy = atoi(argv[globalUtilOptind]);
      iVar1 = fFancy;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_0026ea10;
      }
      LevL = atoi(argv[globalUtilOptind]);
      iVar1 = LevL;
      break;
    case 0x62:
      fUseWeights = fUseWeights ^ 1;
      goto LAB_0026e5eb;
    case 0x66:
      fRandom = fRandom ^ 1;
      goto LAB_0026e5eb;
    case 0x68:
      goto LAB_0026ea10;
    case 0x69:
      fVerbose = fVerbose ^ 1;
      goto LAB_0026e5eb;
    case 0x6d:
      fVeryVerbose = fVeryVerbose ^ 1;
      goto LAB_0026e5eb;
    case 0x6f:
      fUseBuf = fUseBuf ^ 1;
      goto LAB_0026e5eb;
    case 0x72:
      fInputs = fInputs ^ 1;
      goto LAB_0026e5eb;
    case 0x75:
      fSkipMffc = fSkipMffc ^ 1;
      goto LAB_0026e5eb;
    case 0x76:
      pFile._4_4_ = pFile._4_4_ ^ 1;
      goto LAB_0026e5eb;
    case 0x77:
      pFile._0_4_ = (uint)pFile ^ 1;
      goto LAB_0026e5eb;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_0026ea10:
      Abc_Print(-2,"usage: runsim [-WBLU] [-ofbruimvwh] [-N <num>] <file1> <file2> <file3>\n");
      Abc_Print(-2,"\t           experimental simulation command\n");
      Abc_Print(-2,"\t-W <num> : the number of words of simulation info [default = %d]\n",
                (ulong)(uint)LevL);
      Abc_Print(-2,"\t-B <num> : the beam width parameter [default = %d]\n",(ulong)(uint)LevU);
      Abc_Print(-2,"\t-L <num> : the lower bound on level [default = %d]\n",(ulong)(uint)fOrder);
      Abc_Print(-2,"\t-U <num> : the upper bound on level [default = %d]\n",(ulong)(uint)fFancy);
      pcVar2 = "no";
      if (fUseBuf != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-o       : toggle using a different node ordering [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (fRandom != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-f       : toggle using experimental feature [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (fUseWeights != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-b       : toggle using buffers [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (fInputs != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,
                "\t-r       : toggle using random permutation of support variables [default = %s]\n"
                ,pcVar2);
      pcVar2 = "no";
      if (fSkipMffc != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,
                "\t-u       : toggle using topological info to select support variables [default = %s]\n"
                ,pcVar2);
      pcVar2 = "no";
      if (fVerbose != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-i       : toggle using primary inputs as support variables [default = %s]\n",
                pcVar2);
      pcVar2 = "no";
      if (fVeryVerbose != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-m       : toggle MFFC nodes as candidate divisors [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (pFile._4_4_ != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v       : toggle printing verbose information [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if ((uint)pFile != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-w       : toggle printing more verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandRunSim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Acb_NtkRunSim( char * pFileName[4], int nWords, int nBeam, int LevL, int LevU, int fOrder, int fFancy, int fUseBuf, int fRandom, int fUseWeights, int fInputs, int fSkipMffc, int fVerbose, int fVeryVerbose );
    char * pFileNames[4] = {NULL, NULL, "out.v", NULL};
    int c, nWords = 8, nBeam = 4, LevL = -1, LevU = -1, fOrder = 0, fFancy = 0, fUseBuf = 0, fRandom = 0, fUseWeights = 0, fInputs = 0, fSkipMffc = 0, fVerbose = 0, fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WBLUofbruimvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            nBeam = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBeam < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            LevL = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( LevL < 0 )
                goto usage;
            break;
        case 'U':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-U\" should be followed by an integer.\n" );
                goto usage;
            }
            LevU = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( LevU < 0 )
                goto usage;
            break;
        case 'o':
            fOrder ^= 1;
            break;
        case 'f':
            fFancy ^= 1;
            break;
        case 'b':
            fUseBuf ^= 1;
            break;
        case 'r':
            fRandom ^= 1;
            break;
        case 'u':
            fUseWeights ^= 1;
            break;
        case 'i':
            fInputs ^= 1;
            break;
        case 'm':
            fSkipMffc ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc - globalUtilOptind < 2 || argc - globalUtilOptind > 4 )
    {
        Abc_Print( 1, "Expecting two or three file names on the command line.\n" );
        goto usage;
    }
    Gia_ManRandom(1);
    for ( c = 0; c < argc - globalUtilOptind; c++ )
        pFileNames[c] = argv[globalUtilOptind+c];
    for ( c = 0; c < argc - globalUtilOptind - 1; c++ )
    {
        FILE * pFile = fopen( pFileNames[c], "rb" );
        if ( pFile == NULL )
        {
            printf( "Cannot open input file \"%s\".\n", pFileNames[c] );
            return 0;
        }
        else
            fclose( pFile );
    }
    Acb_NtkRunSim( pFileNames, nWords, nBeam, LevL, LevU, fOrder, fFancy, fUseBuf, fRandom, fUseWeights, fInputs, fSkipMffc, fVerbose, fVeryVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: runsim [-WBLU] [-ofbruimvwh] [-N <num>] <file1> <file2> <file3>\n" );
    Abc_Print( -2, "\t           experimental simulation command\n" );
    Abc_Print( -2, "\t-W <num> : the number of words of simulation info [default = %d]\n", nWords );
    Abc_Print( -2, "\t-B <num> : the beam width parameter [default = %d]\n", nBeam );
    Abc_Print( -2, "\t-L <num> : the lower bound on level [default = %d]\n", LevL );
    Abc_Print( -2, "\t-U <num> : the upper bound on level [default = %d]\n", LevU );
    Abc_Print( -2, "\t-o       : toggle using a different node ordering [default = %s]\n", fOrder? "yes": "no" );
    Abc_Print( -2, "\t-f       : toggle using experimental feature [default = %s]\n",      fFancy? "yes": "no" );
    Abc_Print( -2, "\t-b       : toggle using buffers [default = %s]\n",                   fUseBuf? "yes": "no" );
    Abc_Print( -2, "\t-r       : toggle using random permutation of support variables [default = %s]\n",      fRandom? "yes": "no" );
    Abc_Print( -2, "\t-u       : toggle using topological info to select support variables [default = %s]\n", fUseWeights? "yes": "no" );
    Abc_Print( -2, "\t-i       : toggle using primary inputs as support variables [default = %s]\n",          fInputs? "yes": "no" );
    Abc_Print( -2, "\t-m       : toggle MFFC nodes as candidate divisors [default = %s]\n",                   fSkipMffc? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing verbose information [default = %s]\n",                       fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing more verbose information [default = %s]\n",                  fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}